

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Error
Qiniu_callex(CURL *curl,Qiniu_Buffer *resp,Qiniu_Json **ret,Qiniu_Bool simpleError,
            Qiniu_Buffer *resph)

{
  size_t sVar1;
  char *value;
  Qiniu_Error QVar2;
  Qiniu_Json *local_58;
  Qiniu_Json *root;
  long httpCode;
  Qiniu_Buffer *pQStack_40;
  CURLcode curlCode;
  Qiniu_Buffer *resph_local;
  Qiniu_Json **ppQStack_30;
  Qiniu_Bool simpleError_local;
  Qiniu_Json **ret_local;
  Qiniu_Buffer *resp_local;
  CURL *curl_local;
  Qiniu_Error err;
  
  pQStack_40 = resph;
  resph_local._4_4_ = simpleError;
  ppQStack_30 = ret;
  ret_local = (Qiniu_Json **)resp;
  resp_local = (Qiniu_Buffer *)curl;
  curl_easy_setopt(curl,0x4e2b,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(resp_local,0x2711,ret_local);
  if (pQStack_40 != (Qiniu_Buffer *)0x0) {
    curl_easy_setopt(resp_local,0x4e6f,Qiniu_Buffer_Fwrite);
    curl_easy_setopt(resp_local,0x272d,pQStack_40);
  }
  httpCode._4_4_ = curl_easy_perform(resp_local);
  if (httpCode._4_4_ == 0) {
    curl_easy_getinfo(resp_local,0x200002,&root);
    sVar1 = Qiniu_Buffer_Len((Qiniu_Buffer *)ret_local);
    if (sVar1 == 0) {
      local_58 = (Qiniu_Json *)0x0;
    }
    else {
      value = Qiniu_Buffer_CStr((Qiniu_Buffer *)ret_local);
      local_58 = cJSON_Parse(value);
    }
    *ppQStack_30 = local_58;
    curl_local._0_4_ = (uint)root;
    if ((long)root / 100 == 2) {
      err._0_8_ = (long)"QINIU_CRYPTO_RESULT_OK" + 0x14;
    }
    else if (resph_local._4_4_ == 0) {
      err._0_8_ = Qiniu_Json_GetString(local_58,"error","http status code is not OK");
    }
    else {
      err._0_8_ = g_statusCodeError;
    }
  }
  else {
    *ppQStack_30 = (Qiniu_Json *)0x0;
    err._0_8_ = anon_var_dwarf_48753;
    curl_local._0_4_ = httpCode._4_4_;
  }
  QVar2._4_4_ = 0;
  QVar2.code = (uint)curl_local;
  QVar2.message = (char *)err._0_8_;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_callex(CURL *curl, Qiniu_Buffer *resp, Qiniu_Json **ret, Qiniu_Bool simpleError,
                         Qiniu_Buffer *resph)
{
    Qiniu_Error err;
    CURLcode curlCode;
    long httpCode;
    Qiniu_Json *root;

    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, Qiniu_Buffer_Fwrite);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, resp);
    if (resph != NULL)
    {
        curl_easy_setopt(curl, CURLOPT_HEADERFUNCTION, Qiniu_Buffer_Fwrite);
        curl_easy_setopt(curl, CURLOPT_WRITEHEADER, resph);
    }

    curlCode = curl_easy_perform(curl);

    if (curlCode == 0)
    {
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &httpCode);
        if (Qiniu_Buffer_Len(resp) != 0)
        {
            root = cJSON_Parse(Qiniu_Buffer_CStr(resp));
        }
        else
        {
            root = NULL;
        }
        *ret = root;
        err.code = (int)httpCode;
        if (httpCode / 100 != 2)
        {
            if (simpleError)
            {
                err.message = g_statusCodeError;
            }
            else
            {
                err.message = Qiniu_Json_GetString(root, "error", g_statusCodeError);
            }
        }
        else
        {
            err.message = "OK";
        }
    }
    else
    {
        *ret = NULL;
        err.code = curlCode;
        err.message = "curl_easy_perform error";
    }

    return err;
}